

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O1

base_uint<256U> * __thiscall
base_uint<256U>::operator-(base_uint<256U> *__return_storage_ptr__,base_uint<256U> *this)

{
  uint32_t *puVar1;
  long lVar2;
  undefined1 auVar3 [16];
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint(__return_storage_ptr__);
  lVar4 = 0;
  do {
    auVar3._8_4_ = 0xffffffff;
    auVar3._0_8_ = 0xffffffffffffffff;
    auVar3._12_4_ = 0xffffffff;
    *(undefined1 (*) [16])(__return_storage_ptr__->pn + lVar4) =
         *(undefined1 (*) [16])(this->pn + lVar4) ^ auVar3;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 8);
  lVar4 = 0;
  do {
    puVar1 = __return_storage_ptr__->pn + lVar4;
    *puVar1 = *puVar1 + 1;
    if (*puVar1 != 0) break;
    bVar5 = lVar4 != 7;
    lVar4 = lVar4 + 1;
  } while (bVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

base_uint operator-() const
    {
        base_uint ret;
        for (int i = 0; i < WIDTH; i++)
            ret.pn[i] = ~pn[i];
        ++ret;
        return ret;
    }